

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

char * process_string(char *input,size_t input_len,size_t *output_len)

{
  JSON_Status JVar1;
  char *pcVar2;
  char *resized_output;
  char *output_ptr;
  char *output;
  size_t final_size;
  size_t initial_size;
  char *input_ptr;
  size_t *output_len_local;
  size_t input_len_local;
  char *input_local;
  
  final_size = input_len + 1;
  output = (char *)0x0;
  output_ptr = (char *)0x0;
  resized_output = (char *)0x0;
  initial_size = (size_t)input;
  input_ptr = (char *)output_len;
  output_len_local = (size_t *)input_len;
  input_len_local = (size_t)input;
  output_ptr = (char *)(*parson_malloc)(final_size);
  pcVar2 = output_ptr;
  if (output_ptr != (char *)0x0) {
    for (; resized_output = pcVar2,
        *(char *)initial_size != '\0' &&
        (size_t *)(initial_size - input_len_local) < output_len_local;
        initial_size = initial_size + 1) {
      if (*(char *)initial_size == '\\') {
        initial_size = initial_size + 1;
        switch(*(undefined1 *)initial_size) {
        case 0x22:
          *resized_output = '\"';
          break;
        default:
          goto LAB_001b0dc6;
        case 0x2f:
          *resized_output = '/';
          break;
        case 0x5c:
          *resized_output = '\\';
          break;
        case 0x62:
          *resized_output = '\b';
          break;
        case 0x66:
          *resized_output = '\f';
          break;
        case 0x6e:
          *resized_output = '\n';
          break;
        case 0x72:
          *resized_output = '\r';
          break;
        case 0x74:
          *resized_output = '\t';
          break;
        case 0x75:
          JVar1 = parse_utf16((char **)&initial_size,&resized_output);
          if (JVar1 != 0) goto LAB_001b0dc6;
        }
      }
      else {
        if (*(byte *)initial_size < 0x20) goto LAB_001b0dc6;
        *resized_output = *(char *)initial_size;
      }
      pcVar2 = resized_output + 1;
    }
    *resized_output = '\0';
    output = resized_output + (1 - (long)output_ptr);
    pcVar2 = (char *)(*parson_malloc)((size_t)output);
    if (pcVar2 != (char *)0x0) {
      memcpy(pcVar2,output_ptr,(size_t)output);
      *(char **)input_ptr = output + -1;
      (*parson_free)(output_ptr);
      return pcVar2;
    }
  }
LAB_001b0dc6:
  (*parson_free)(output_ptr);
  return (char *)0x0;
}

Assistant:

static char* process_string(const char *input, size_t input_len, size_t *output_len) {
    const char *input_ptr = input;
    size_t initial_size = (input_len + 1) * sizeof(char);
    size_t final_size = 0;
    char *output = NULL, *output_ptr = NULL, *resized_output = NULL;
    output = (char*)parson_malloc(initial_size);
    if (output == NULL) {
        goto error;
    }
    output_ptr = output;
    while ((*input_ptr != '\0') && (size_t)(input_ptr - input) < input_len) {
        if (*input_ptr == '\\') {
            input_ptr++;
            switch (*input_ptr) {
                case '\"': *output_ptr = '\"'; break;
                case '\\': *output_ptr = '\\'; break;
                case '/':  *output_ptr = '/';  break;
                case 'b':  *output_ptr = '\b'; break;
                case 'f':  *output_ptr = '\f'; break;
                case 'n':  *output_ptr = '\n'; break;
                case 'r':  *output_ptr = '\r'; break;
                case 't':  *output_ptr = '\t'; break;
                case 'u':
                    if (parse_utf16(&input_ptr, &output_ptr) != JSONSuccess) {
                        goto error;
                    }
                    break;
                default:
                    goto error;
            }
        } else if ((unsigned char)*input_ptr < 0x20) {
            goto error; /* 0x00-0x19 are invalid characters for json string (http://www.ietf.org/rfc/rfc4627.txt) */
        } else {
            *output_ptr = *input_ptr;
        }
        output_ptr++;
        input_ptr++;
    }
    *output_ptr = '\0';
    /* resize to new length */
    final_size = (size_t)(output_ptr-output) + 1;
    /* todo: don't resize if final_size == initial_size */
    resized_output = (char*)parson_malloc(final_size);
    if (resized_output == NULL) {
        goto error;
    }
    memcpy(resized_output, output, final_size);
    *output_len = final_size - 1;
    parson_free(output);
    return resized_output;
error:
    parson_free(output);
    return NULL;
}